

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O1

int OCTET_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                      void *app_key)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  ulong uVar6;
  char scratch [52];
  char local_68 [56];
  
  if ((sptr == (void *)0x0) ||
     ((pbVar4 = *sptr, pbVar4 == (byte *)0x0 && (*(int *)((long)sptr + 8) != 0)))) {
    iVar3 = (*cb)("<absent>",8,app_key);
    iVar3 = iVar3 >> 0x1f;
  }
  else {
    pcVar5 = local_68;
    if (0 < (long)*(int *)((long)sptr + 8)) {
      pbVar1 = pbVar4 + *(int *)((long)sptr + 8);
      uVar6 = 0;
      do {
        if (((uVar6 & 0xf) == 0) && ((uVar6 != 0 || (0x10 < *(int *)((long)sptr + 8))))) {
          iVar3 = (*cb)(local_68,(long)pcVar5 - (long)local_68,app_key);
          if (iVar3 < 0) {
            return -1;
          }
          iVar3 = (*cb)("\n",1,app_key);
          if (iVar3 < 0) {
            return -1;
          }
          pcVar5 = local_68;
          iVar3 = ilevel;
          if (0 < ilevel) {
            do {
              iVar2 = (*cb)(" ",1,app_key);
              if (iVar2 < 0) {
                return -1;
              }
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            pcVar5 = local_68;
          }
        }
        *pcVar5 = "0123456789ABCDEF"[*pbVar4 >> 4];
        pcVar5[1] = "0123456789ABCDEF"[*pbVar4 & 0xf];
        pcVar5[2] = ' ';
        pcVar5 = pcVar5 + 3;
        pbVar4 = pbVar4 + 1;
        uVar6 = uVar6 + 1;
      } while (pbVar4 < pbVar1);
    }
    if ((local_68 < pcVar5) &&
       (iVar3 = (*cb)(local_68,(size_t)(pcVar5 + ~(ulong)local_68),app_key), iVar3 < 0)) {
      iVar3 = -1;
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
OCTET_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
	asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	(void)td;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	for(i = 0; buf < end; buf++, i++) {
		if(!(i % 16) && (i || st->size > 16)) {
			if(cb(scratch, p - scratch, app_key) < 0)
				return -1;
			_i_INDENT(1);
			p = scratch;
		}
		*p++ = h2c[(*buf >> 4) & 0x0F];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Remove the tail space */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}